

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opensketch.h
# Opt level: O2

void __thiscall OpenSketch<4U>::OpenSketch(OpenSketch<4U> *this,int num,int _HIT)

{
  undefined1 auVar1 [16];
  int iVar2;
  ulong *puVar3;
  int *__s;
  KV<4U> *__s_00;
  long lVar4;
  size_t sVar5;
  BitSet *this_00;
  ulong uVar6;
  
  Abstract<4U>::Abstract(&this->super_Abstract<4U>);
  (this->super_Abstract<4U>)._vptr_Abstract = (_func_int **)&PTR_Init_00111cb8;
  (this->mp)._M_h._M_buckets = &(this->mp)._M_h._M_single_bucket;
  (this->mp)._M_h._M_bucket_count = 1;
  (this->mp)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mp)._M_h._M_element_count = 0;
  (this->mp)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mp)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mp)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_Abstract<4U>).HIT = _HIT;
  *(undefined4 *)&(this->super_Abstract<4U>).field_0x6c = 0x80;
  this->CAPACITY = 0xfa;
  this->heap_num = 0;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)num - 12000;
  iVar2 = SUB164(auVar1 / ZEXT816(0x14),0);
  this->COLUMN = iVar2;
  lVar4 = SUB168(auVar1 / ZEXT816(0x14),0) << 0x20;
  uVar6 = (ulong)iVar2;
  puVar3 = (ulong *)operator_new__(-(ulong)(uVar6 >> 0x3c != 0) | lVar4 >> 0x1c | 8);
  *puVar3 = uVar6;
  if (lVar4 != 0) {
    lVar4 = 0;
    this_00 = (BitSet *)(puVar3 + 1);
    do {
      BitSet::BitSet(this_00,0x80);
      lVar4 = lVar4 + -0x10;
      this_00 = this_00 + 1;
    } while (-lVar4 != uVar6 * 0x10);
    iVar2 = this->COLUMN;
  }
  this->bitset = (BitSet *)(puVar3 + 1);
  sVar5 = (long)iVar2 * 4;
  if (iVar2 < 0) {
    sVar5 = 0xffffffffffffffff;
  }
  __s = (int *)operator_new__(sVar5);
  this->counter = __s;
  memset(__s,0,(long)iVar2 * 4);
  iVar2 = this->CAPACITY;
  sVar5 = (long)iVar2 * 8;
  uVar6 = 0xffffffffffffffff;
  if (-1 < (long)iVar2) {
    uVar6 = sVar5;
  }
  __s_00 = (KV<4U> *)operator_new__(uVar6);
  if (iVar2 != 0) {
    memset(__s_00,0,sVar5);
  }
  this->heap = __s_00;
  memset(__s_00,0,sVar5);
  (this->super_Abstract<4U>).pr = 0.0;
  (this->super_Abstract<4U>).cr = 0.0;
  (this->super_Abstract<4U>).aae = 0.0;
  (this->super_Abstract<4U>).are = 0.0;
  std::__cxx11::string::assign((char *)&(this->super_Abstract<4U>).sep);
  std::__cxx11::string::assign((char *)&(this->super_Abstract<4U>).name);
  return;
}

Assistant:

OpenSketch(int num, int _HIT) {
		this->HIT = _HIT;
		LENGTH = 128;
		CAPACITY = 250;
		COLUMN = (num - 6 * CAPACITY * sizeof(KV<DATA_LEN>)) / 20;
		heap_num = 0;
		bitset = new BitSet[COLUMN];
		counter = new int[COLUMN];
		memset(counter, 0, sizeof(int) * COLUMN);
		heap = new KV<DATA_LEN>[CAPACITY];
		memset(heap, 0, sizeof(KV<DATA_LEN>) * CAPACITY);
		this->aae = this->are = this->pr = this->cr = 0;
		this->sep = "\t\t";
		this->name = "OpenSketch";
	}